

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder-helper.c
# Opt level: O1

int tlv_interest_get_header
              (uint8_t *interest,size_t buflen,interest_options_t *options,uint8_t **name,
              size_t *name_len)

{
  ulong in_RAX;
  uint8_t *puVar1;
  byte *buf;
  uint32_t *puVar2;
  ulong uVar3;
  uint64_t uVar4;
  byte *pbVar5;
  undefined8 local_38;
  uint32_t real_type;
  uint32_t real_len;
  
  local_38 = in_RAX;
  puVar1 = tlv_get_type_length(interest,buflen,(uint32_t *)&local_38,
                               (uint32_t *)((long)&local_38 + 4));
  if (puVar1 != (uint8_t *)0x0) {
    if ((uint32_t)local_38 != 5) {
      return -0xc;
    }
    if (interest + (buflen - (long)puVar1) != (uint8_t *)(local_38 >> 0x20)) {
      return -0xd;
    }
    *name = puVar1;
    puVar1 = tlv_get_type_length(puVar1,(size_t)(interest + (buflen - (long)puVar1)),
                                 (uint32_t *)&local_38,(uint32_t *)((long)&local_38 + 4));
    if (puVar1 != (uint8_t *)0x0) {
      if ((uint32_t)local_38 != 7) {
        return -0x11;
      }
      *name_len = local_38 >> 0x20;
      if (options == (interest_options_t *)0x0) {
        return 0;
      }
      buf = puVar1 + (local_38 >> 0x20);
      options->must_be_fresh = false;
      options->lifetime = 4000;
      options->hop_limit = '\0';
      options->can_be_prefix = false;
      options->nonce = 0;
      pbVar5 = interest + buflen;
      if (pbVar5 <= buf) {
        return 0;
      }
      while (puVar2 = (uint32_t *)
                      tlv_get_type_length(buf,(long)pbVar5 - (long)buf,(uint32_t *)&local_38,
                                          (uint32_t *)((long)&local_38 + 4)),
            puVar2 != (uint32_t *)0x0) {
        if ((uint32_t)local_38 == 0x12) {
          options->must_be_fresh = true;
        }
        else if ((uint32_t)local_38 == 0x21) {
          options->can_be_prefix = true;
        }
        else if (local_38._4_4_ == 1 && (uint32_t)local_38 == 0x22) {
          options->hop_limit = (byte)*puVar2;
        }
        else {
          uVar3 = (ulong)local_38._4_4_;
          if (local_38._4_4_ == 4 && (uint32_t)local_38 == 10) {
            options->nonce = *puVar2;
          }
          else if ((uint32_t)local_38 == 0xc) {
            if (uVar3 == 0) {
              uVar4 = 0;
            }
            else {
              uVar4 = 0;
              do {
                uVar4 = uVar4 << 8 | (ulong)(byte)*puVar2;
                uVar3 = uVar3 - 1;
              } while (uVar3 != 0);
            }
            options->lifetime = uVar4;
          }
        }
        buf = (byte *)((long)puVar2 + (ulong)local_38._4_4_);
        if (pbVar5 <= buf) {
          return 0;
        }
      }
    }
  }
  return -0xe;
}

Assistant:

int
tlv_interest_get_header(uint8_t* interest,
                        size_t buflen,
                        interest_options_t* options,
                        uint8_t** name,
                        size_t* name_len)
{
  uint32_t real_type, real_len;
  uint8_t* ptr;

  ptr = tlv_get_type_length(interest, buflen, &real_type, &real_len);
  if (ptr == NULL) {
    return NDN_OVERSIZE_VAR;
  }
  if (real_type != TLV_Interest) {
    return NDN_WRONG_TLV_TYPE;
  }
  if (real_len != buflen - (ptr - interest)) {
    return NDN_WRONG_TLV_LENGTH;
  }

  // Name
  *name = ptr;
  ptr = tlv_get_type_length(ptr, buflen - (ptr - interest), &real_type, &real_len);
  if(ptr == NULL){
    return NDN_OVERSIZE_VAR;
  }
  if(real_type != TLV_Name){
    return NDN_UNSUPPORTED_FORMAT;
  }
  *name_len = real_len;
  ptr += real_len;

  // Options
  if(options == NULL){
    return NDN_SUCCESS;
  }
  options->can_be_prefix = false;
  options->must_be_fresh = false;
  options->lifetime = NDN_DEFAULT_INTEREST_LIFETIME;
  options->hop_limit = 0;
  options->nonce = 0;
  while (ptr < interest + buflen) {
    ptr = tlv_get_type_length(ptr, buflen - (ptr - interest), &real_type, &real_len);
    if(ptr == NULL){
      return NDN_OVERSIZE_VAR;
    }
    if (real_type == TLV_CanBePrefix) {
      options->can_be_prefix = true;
    }
    else if (real_type == TLV_MustBeFresh) {
      options->must_be_fresh = true;
    }
    else if (real_type == TLV_HopLimit && real_len == sizeof(options->hop_limit)) {
      options->hop_limit = *ptr;
    }
    else if (real_type == TLV_Nonce && real_len == sizeof(options->nonce)) {
      memcpy(&options->nonce, ptr, sizeof(options->nonce));
    }
    else if (real_type == TLV_InterestLifetime) {
      options->lifetime = tlv_get_uint(ptr, real_len);
    }
    ptr += real_len;
  }
  return NDN_SUCCESS;
}